

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall
crnlib::mipmapped_texture::set_orientation_flags(mipmapped_texture *this,orientation_flags_t flags)

{
  vector<crnlib::mip_level_*> *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((this->m_faces).m_size != 0) {
    uVar2 = 0;
    do {
      pvVar1 = (this->m_faces).m_p;
      if (pvVar1[uVar2].m_size != 0) {
        uVar3 = 0;
        do {
          pvVar1[uVar2].m_p[uVar3]->m_orient_flags = flags;
          uVar3 = uVar3 + 1;
          pvVar1 = (this->m_faces).m_p;
        } while (uVar3 < pvVar1[uVar2].m_size);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->m_faces).m_size);
  }
  return;
}

Assistant:

void mipmapped_texture::set_orientation_flags(orientation_flags_t flags) {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      m_faces[l][m]->set_orientation_flags(flags);
}